

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPrivKeys
          (LegacyScriptPubKeyMan *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  _Base_ptr *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  size_t sVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Span<const_unsigned_char> s;
  WalletBatch batch;
  CPubKey pubkey;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *this_01;
  _Base_ptr p_Var7;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> in_stack_ffffffffffffff50;
  string local_a0;
  CPubKey local_79;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x70))
            (&stack0xffffffffffffff50,(long *)CONCAT44(extraout_var,iVar2),1);
  p_Var4 = (privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar6 = p_Var4 == p_Var7;
  if (!bVar6) {
    this_01 = &(this->super_LegacyDataSPKM).mapKeyMetadata;
    do {
      this_00 = &p_Var4[1]._M_right;
      CKey::GetPubKey(&local_79,(CKey *)this_00);
      bVar1 = CKey::VerifyPubKey((CKey *)this_00,&local_79);
      if (!bVar1) {
        __assert_fail("key.VerifyPubKey(pubkey)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x65d,
                      "bool wallet::LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey> &, const int64_t)"
                     );
      }
      iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                        (this,p_Var4 + 1);
      if ((char)iVar2 == '\0') {
        pmVar3 = std::
                 map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 ::operator[](this_01,(key_type *)(p_Var4 + 1));
        pmVar3->nCreateTime = timestamp;
        bVar1 = AddKeyPubKeyWithDB(this,(WalletBatch *)&stack0xffffffffffffff50,(CKey *)this_00,
                                   &local_79);
        iVar2 = 1;
        if (bVar1) {
          iVar2 = 0;
          UpdateTimeFirstKey(this,timestamp);
        }
      }
      else {
        sVar5 = 0x21;
        if ((local_79.vch[0] & 0xfe) != 2) {
          if ((byte)(local_79.vch[0] - 4) < 4) {
            sVar5 = (&DAT_00e8a840)[(byte)(local_79.vch[0] - 4)];
          }
          else {
            sVar5 = 0;
          }
        }
        s.m_size = sVar5;
        s.m_data = local_79.vch;
        HexStr_abi_cxx11_(&local_a0,s);
        parameters._M_string_length = (size_type)this_01;
        parameters._M_dataplus._M_p = (pointer)timestamp;
        parameters.field_2._M_allocated_capacity = (size_type)p_Var7;
        parameters.field_2._8_8_ = in_stack_ffffffffffffff50._M_head_impl;
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  ((ScriptPubKeyMan *)this,"Already have key with pubkey %s, skipping\n",parameters)
        ;
        iVar2 = 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((iVar2 != 3) && (iVar2 != 0)) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      bVar6 = p_Var4 == p_Var7;
    } while (!bVar6);
  }
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)in_stack_ffffffffffffff50._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(in_stack_ffffffffffffff50._M_head_impl)->_vptr_DatabaseBatch[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : privkey_map) {
        const CKey& key = entry.second;
        CPubKey pubkey = key.GetPubKey();
        const CKeyID& id = entry.first;
        assert(key.VerifyPubKey(pubkey));
        // Skip if we already have the key
        if (HaveKey(id)) {
            WalletLogPrintf("Already have key with pubkey %s, skipping\n", HexStr(pubkey));
            continue;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;
        // If the private key is not present in the wallet, insert it.
        if (!AddKeyPubKeyWithDB(batch, key, pubkey)) {
            return false;
        }
        UpdateTimeFirstKey(timestamp);
    }
    return true;
}